

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
FastVector<ExternSourceInfo,_false,_false>::grow
          (FastVector<ExternSourceInfo,_false,_false> *this,uint newSize)

{
  uint uVar1;
  ExternSourceInfo *ptr;
  uint oldMax;
  ExternSourceInfo *oldData;
  uint newSize_local;
  FastVector<ExternSourceInfo,_false,_false> *this_local;
  
  ptr = this->data;
  uVar1 = this->max;
  grow_no_destroy(this,newSize);
  if (ptr != (ExternSourceInfo *)0x0) {
    NULLC::destruct<ExternSourceInfo>(ptr,(ulong)uVar1);
  }
  return;
}

Assistant:

void grow(unsigned newSize)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}